

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutSeq.c
# Opt level: O0

void Cut_NodeShiftCutLeaves(Cut_Cut_t *pList,int nLat)

{
  uint uVar1;
  int local_24;
  Cut_Cut_t *pCStack_20;
  int i;
  Cut_Cut_t *pTemp;
  int nLat_local;
  Cut_Cut_t *pList_local;
  
  for (pCStack_20 = pList; pCStack_20 != (Cut_Cut_t *)0x0; pCStack_20 = pCStack_20->pNext) {
    pCStack_20->uSign = 0;
    for (local_24 = 0; local_24 < (int)(*(uint *)pCStack_20 >> 0x1c); local_24 = local_24 + 1) {
      *(uint *)((long)&pCStack_20[1].field_0x0 + (long)local_24 * 4) =
           nLat + *(uint *)((long)&pCStack_20[1].field_0x0 + (long)local_24 * 4);
      uVar1 = Cut_NodeSign(*(uint *)((long)&pCStack_20[1].field_0x0 + (long)local_24 * 4));
      pCStack_20->uSign = uVar1 | pCStack_20->uSign;
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Shifts all cut leaves of the node by the given number of latches.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline void Cut_NodeShiftCutLeaves( Cut_Cut_t * pList, int nLat )
{
    Cut_Cut_t * pTemp;
    int i;
    // shift the cuts by as many latches
    Cut_ListForEachCut( pList, pTemp )
    {
        pTemp->uSign = 0;
        for ( i = 0; i < (int)pTemp->nLeaves; i++ )
        {
            pTemp->pLeaves[i] += nLat;
            pTemp->uSign      |= Cut_NodeSign( pTemp->pLeaves[i] );
        }
    }
}